

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O0

void zcopy(int n,complex<double> *cx,int incx,complex<double> *cy,int incy)

{
  int local_38;
  int local_34;
  int iy;
  int ix;
  int i;
  int incy_local;
  complex<double> *cy_local;
  int incx_local;
  complex<double> *cx_local;
  int n_local;
  
  if (0 < n) {
    if ((incx == 1) && (incy == 1)) {
      for (iy = 0; iy < n; iy = iy + 1) {
        *(undefined8 *)cy[iy]._M_value = *(undefined8 *)cx[iy]._M_value;
        *(undefined8 *)(cy[iy]._M_value + 8) = *(undefined8 *)(cx[iy]._M_value + 8);
      }
    }
    else {
      if (incx < 0) {
        local_34 = (1 - n) * incx;
      }
      else {
        local_34 = 0;
      }
      if (incy < 0) {
        local_38 = (1 - n) * incy;
      }
      else {
        local_38 = 0;
      }
      for (iy = 0; iy < n; iy = iy + 1) {
        *(undefined8 *)cy[local_38]._M_value = *(undefined8 *)cx[local_34]._M_value;
        *(undefined8 *)(cy[local_38]._M_value + 8) = *(undefined8 *)(cx[local_34]._M_value + 8);
        local_34 = local_34 + incx;
        local_38 = local_38 + incy;
      }
    }
  }
  return;
}

Assistant:

void zcopy ( int n, complex <double> cx[], int incx, complex <double> cy[],
  int incy )

//****************************************************************************80
//
//  Purpose:
//
//    ZCOPY copies a complex <double> vector.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of elements in CX and CY.
//
//    Input, complex <double> CX[], the first vector.
//
//    Input, int INCX, the increment between successive entries of CX.
//
//    Output, complex <double> CY[], the second vector.
//
//    Input, int INCY, the increment between successive entries of CY.
//
{
  int i;
  int ix;
  int iy;

  if ( n <= 0 )
  {
    return;
  }

  if ( incx != 1 || incy != 1 )
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      cy[iy] = cx[ix];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      cy[i] = cx[i];
    }
  }
  return;
}